

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::disallow_forwarding_in_expression_chain
          (CompilerGLSL *this,SPIRExpression *expr)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  size_t sVar1;
  TypedID<(spirv_cross::Types)0> *pTVar2;
  const_iterator cVar3;
  SPIRExpression *expr_00;
  long lVar4;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_30;
  uint32_t local_24;
  
  this_00 = &(this->super_Compiler).forced_invariant_temporaries;
  local_30._0_4_ = (expr->super_IVariant).self.id;
  cVar3 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,(key_type *)&local_30);
  if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    local_30 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)CONCAT44(local_30._4_4_,(expr->super_IVariant).self.id);
    cVar3 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->super_Compiler).suppressed_usage_tracking._M_h,(key_type *)&local_30);
    if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      force_temporary_and_recompile(this,(expr->super_IVariant).self.id);
    }
    local_24 = (expr->super_IVariant).self.id;
    local_30 = &this_00->_M_h;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_00);
    sVar1 = (expr->invariance_dependencies).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar1 != 0) {
      pTVar2 = (expr->invariance_dependencies).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar4 = 0;
      do {
        expr_00 = Variant::get<spirv_cross::SPIRExpression>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)((long)&pTVar2->id + lVar4));
        disallow_forwarding_in_expression_chain(this,expr_00);
        lVar4 = lVar4 + 4;
      } while (sVar1 << 2 != lVar4);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::disallow_forwarding_in_expression_chain(const SPIRExpression &expr)
{
	// Allow trivially forwarded expressions like OpLoad or trivial shuffles,
	// these will be marked as having suppressed usage tracking.
	// Our only concern is to make sure arithmetic operations are done in similar ways.
	if (forced_invariant_temporaries.count(expr.self) == 0)
	{
		if (!expression_suppresses_usage_tracking(expr.self))
			force_temporary_and_recompile(expr.self);
		forced_invariant_temporaries.insert(expr.self);

		for (auto &dependent : expr.invariance_dependencies)
			disallow_forwarding_in_expression_chain(get<SPIRExpression>(dependent));
	}
}